

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int read_private_key_from_file
              (void **key_ctx,pem_read_bio_func read_private_key,char *filename,uchar *passphrase)

{
  BIO *a;
  EVP_PKEY *pEVar1;
  BIO *bp;
  uchar *passphrase_local;
  char *filename_local;
  pem_read_bio_func read_private_key_local;
  void **key_ctx_local;
  
  *key_ctx = (void *)0x0;
  a = BIO_new_file(filename,"r");
  if (a == (BIO *)0x0) {
    key_ctx_local._4_4_ = -1;
  }
  else {
    pEVar1 = (*read_private_key)((BIO *)a,(EVP_PKEY **)0x0,passphrase_cb,passphrase);
    *key_ctx = pEVar1;
    BIO_free(a);
    key_ctx_local._4_4_ = -1;
    if (*key_ctx != (void *)0x0) {
      key_ctx_local._4_4_ = 0;
    }
  }
  return key_ctx_local._4_4_;
}

Assistant:

static int
read_private_key_from_file(void **key_ctx,
                           pem_read_bio_func read_private_key,
                           const char *filename,
                           const unsigned char *passphrase)
{
    BIO * bp;

    *key_ctx = NULL;

    bp = BIO_new_file(filename, "r");
    if(!bp) {
        return -1;
    }

    *key_ctx = read_private_key(bp, NULL, (pem_password_cb *) passphrase_cb,
                                (void *) LIBSSH2_UNCONST(passphrase));

    BIO_free(bp);
    return (*key_ctx) ? 0 : -1;
}